

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart_p.h
# Opt level: O0

void __thiscall QHttpPartPrivate::~QHttpPartPrivate(QHttpPartPrivate *this)

{
  QNetworkHeadersPrivate *in_RDI;
  
  QByteArray::~QByteArray((QByteArray *)0x2e6720);
  QByteArray::~QByteArray((QByteArray *)0x2e672e);
  QNetworkHeadersPrivate::~QNetworkHeadersPrivate(in_RDI);
  return;
}

Assistant:

~QHttpPartPrivate()
    {
    }